

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

void __thiscall
Darts::Details::DoubleArrayBuilder::build_from_keyset<int>
          (DoubleArrayBuilder *this,Keyset<int> *keyset,size_t begin,size_t end,size_t depth,
          id_type dic_id)

{
  byte bVar1;
  id_type iVar2;
  byte bVar3;
  ulong uVar4;
  
  do {
    iVar2 = arrange_from_keyset<int>(this,keyset,begin,end,depth,dic_id);
    if (begin < end) {
      uVar4 = begin;
      do {
        begin = uVar4;
        if (((keyset->lengths_ == (size_t *)0x0) || (depth < keyset->lengths_[begin])) &&
           (keyset->keys_[begin][depth] != '\0')) break;
        uVar4 = begin + 1;
        begin = end;
      } while (end != uVar4);
    }
    if (begin == end) {
      return;
    }
    if ((keyset->lengths_ == (size_t *)0x0) || (depth < keyset->lengths_[begin])) {
      bVar1 = keyset->keys_[begin][depth];
    }
    else {
      bVar1 = 0;
    }
    uVar4 = begin + 1;
    if (uVar4 < end) {
      do {
        if ((keyset->lengths_ == (size_t *)0x0) || (depth < keyset->lengths_[uVar4])) {
          bVar3 = keyset->keys_[uVar4][depth];
        }
        else {
          bVar3 = 0;
        }
        if (bVar3 != bVar1) {
          build_from_keyset<int>(this,keyset,begin,uVar4,depth + 1,bVar1 ^ iVar2);
          begin = uVar4;
          if ((keyset->lengths_ == (size_t *)0x0) || (depth < keyset->lengths_[uVar4])) {
            bVar1 = keyset->keys_[uVar4][depth];
          }
          else {
            bVar1 = 0;
          }
        }
        uVar4 = uVar4 + 1;
      } while (end != uVar4);
    }
    depth = depth + 1;
    dic_id = iVar2 ^ bVar1;
  } while( true );
}

Assistant:

void DoubleArrayBuilder::build_from_keyset(const Keyset<T> &keyset,
    std::size_t begin, std::size_t end, std::size_t depth, id_type dic_id) {
  id_type offset = arrange_from_keyset(keyset, begin, end, depth, dic_id);

  while (begin < end) {
    if (keyset.keys(begin, depth) != '\0') {
      break;
    }
    ++begin;
  }
  if (begin == end) {
    return;
  }

  std::size_t last_begin = begin;
  uchar_type last_label = keyset.keys(begin, depth);
  while (++begin < end) {
    uchar_type label = keyset.keys(begin, depth);
    if (label != last_label) {
      build_from_keyset(keyset, last_begin, begin,
          depth + 1, offset ^ last_label);
      last_begin = begin;
      last_label = keyset.keys(begin, depth);
    }
  }
  build_from_keyset(keyset, last_begin, end, depth + 1, offset ^ last_label);
}